

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O2

void __thiscall
ExprFactoryTest_IntOverflow_Test::~ExprFactoryTest_IntOverflow_Test
          (ExprFactoryTest_IntOverflow_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExprFactoryTest, IntOverflow) {
  ExprFactory f;
  int int_max = std::numeric_limits<int>::max();
  EXPECT_THROW(f.BeginIterated(expr::SUM, int_max / sizeof(void*) + 2),
               mp::OverflowError);
  EXPECT_THROW(f.BeginPLTerm(int_max / (sizeof(double) * 2) + 1),
               mp::OverflowError);
  std::size_t max_size = std::numeric_limits<std::size_t>::max();
  EXPECT_THROW(f.AddFunction(fmt::StringRef("f", max_size), 0),
               mp::OverflowError);
  EXPECT_THROW(f.MakeStringLiteral(fmt::StringRef("s", int_max + 1)),
               mp::OverflowError);
}